

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_int(uchar **p,uchar *start,int val)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  size_t local_30;
  size_t len;
  int ret;
  int val_local;
  uchar *start_local;
  uchar **p_local;
  
  if ((long)*p - (long)start < 1) {
    p_local._4_4_ = -0x6c;
  }
  else {
    local_30 = 1;
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)val;
    sVar3 = 1;
    if ((0 < val) && (sVar3 = local_30, (**p & 0x80) != 0)) {
      if ((long)*p - (long)start < 1) {
        return -0x6c;
      }
      puVar1 = *p;
      *p = puVar1 + -1;
      puVar1[-1] = '\0';
      sVar3 = 2;
    }
    local_30 = sVar3;
    p_local._4_4_ = mbedtls_asn1_write_len(p,start,local_30);
    if (-1 < p_local._4_4_) {
      iVar2 = p_local._4_4_ + (int)local_30;
      p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x02');
      if (-1 < p_local._4_4_) {
        p_local._4_4_ = p_local._4_4_ + iVar2;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_int( unsigned char **p, unsigned char *start, int val )
{
    int ret;
    size_t len = 0;

    // TODO negative values and values larger than 128
    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len += 1;
    *--(*p) = val;

    if( val > 0 && **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_INTEGER ) );

    return( (int) len );
}